

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infozip.cpp
# Opt level: O2

int64_t iz_deflate(int level,char *tgt,char *src,ulg tgtsize,ulg srcsize)

{
  uzoff_t uVar1;
  int64_t iStack_4b240;
  undefined1 auStack_4b230 [8];
  IZDeflate zid;
  BufData buf;
  int local_38;
  ush local_34 [2];
  int method;
  ush att;
  ush flags;
  
  local_34[0] = 0xffff;
  local_34[1] = 0;
  local_38 = 8;
  IZDeflate::IZDeflate((IZDeflate *)auStack_4b230);
  zid._307640_8_ = &zid.read_handle;
  zid._307576_8_ = mem_read;
  zid.head[0x7ffc] = 0;
  zid.head[0x7ffd] = 0;
  zid.head[0x7ffe] = 0;
  zid.head[0x7fff] = 0;
  zid.mesg._0_4_ = level;
  zid.read_handle = src;
  memset(&zid.out_offset,0,0x10000);
  IZDeflate::bi_init((IZDeflate *)auStack_4b230,tgt,(uint)tgtsize,0);
  IZDeflate::ct_init((IZDeflate *)auStack_4b230,local_34,&local_38);
  IZDeflate::lm_init((IZDeflate *)auStack_4b230,(int)zid.mesg + (uint)((int)zid.mesg == 0),
                     local_34 + 1);
  uVar1 = IZDeflate::deflate((IZDeflate *)auStack_4b230);
  if (local_38 == 0) {
    iStack_4b240 = -2;
  }
  else {
    iStack_4b240 = (long)(int)zid.bi_buf + (uVar1 & 0xffffffff) * 8 + -8;
  }
  return iStack_4b240;
}

Assistant:

int64_t iz_deflate(int level, char* tgt, char* src, ulg tgtsize, ulg srcsize)
{
    ush att = (ush)UNKNOWN;
    ush flags = 0;
    unsigned long out_total = 0;
    int method = DEFLATE;

    IZDeflate zid;
    BufData buf;
    buf.in_buf = src;
    buf.in_size = (unsigned)srcsize;
    buf.in_offset = 0;
    buf.zid = &zid;
    buf.fail = false;

    zid.read_buf = mem_read;
    zid.read_handle = &buf;
    zid.window_size = 0L;
    zid.level = level;
    memset(zid.window, 0, sizeof(zid.window));

    zid.bi_init(tgt, (unsigned)(tgtsize), FALSE);
    zid.ct_init(&att, &method);
    zid.lm_init((zid.level != 0 ? zid.level : 1), &flags);
    out_total = (unsigned)zid.deflate();

    if (buf.fail)
        return -1;

    if (method == STORE)
        return -2;

    // printf("Last bits: %d\n", zid.last_bits);
    return ((out_total - 1) << 3) + zid.last_bits;
}